

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O0

bool __thiscall pbrt::BVHAggregate::IntersectP(BVHAggregate *this,Ray *ray,Float tMax)

{
  bool bVar1;
  long lVar2;
  Vector3<float> *in_RDI;
  long *in_FS_OFFSET;
  int i;
  LinearBVHNode *node;
  int nodesVisited;
  int currentNodeIndex;
  int toVisitOffset;
  int nodesToVisit [64];
  int dirIsNeg [3];
  Vector3f invDir;
  float in_stack_fffffffffffffe38;
  float in_stack_fffffffffffffe3c;
  undefined4 in_stack_fffffffffffffe48;
  int iVar3;
  Primitive *this_00;
  int local_144;
  int local_140;
  int local_13c;
  int aiStack_138 [14];
  int *in_stack_ffffffffffffff00;
  Float in_stack_ffffffffffffff0c;
  Bounds3<float> *in_stack_ffffffffffffff10;
  Tuple3<pbrt::Vector3,_float> in_stack_ffffffffffffff28;
  Tuple3<pbrt::Vector3,_float> in_stack_ffffffffffffff48;
  Tuple3<pbrt::Point3,_float> in_stack_ffffffffffffff68;
  uint local_34 [3];
  float local_28;
  float fStack_24;
  float local_20;
  
  lVar2._0_4_ = in_RDI[3].super_Tuple3<pbrt::Vector3,_float>.y;
  lVar2._4_4_ = in_RDI[3].super_Tuple3<pbrt::Vector3,_float>.z;
  if (lVar2 != 0) {
    Vector3<float>::Vector3(in_RDI,in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38,0.0);
    local_34[0] = (uint)(local_28 < 0.0);
    local_34[1] = (uint)(fStack_24 < 0.0);
    local_34[2] = (uint)(local_20 < 0.0);
    local_13c = 0;
    local_140 = 0;
    local_144 = 0;
    while( true ) {
      while( true ) {
        local_144 = local_144 + 1;
        lVar2 = *(long *)&in_RDI[3].super_Tuple3<pbrt::Vector3,_float>.y + (long)local_140 * 0x20;
        this_00 = (Primitive *)CONCAT44(fStack_24,local_28);
        bVar1 = Bounds3<float>::IntersectP
                          (in_stack_ffffffffffffff10,(Point3f)in_stack_ffffffffffffff68,
                           (Vector3f)in_stack_ffffffffffffff48,in_stack_ffffffffffffff0c,
                           (Vector3f)in_stack_ffffffffffffff28,in_stack_ffffffffffffff00);
        if (!bVar1) break;
        if (*(short *)(lVar2 + 0x1c) == 0) {
          if (local_34[*(byte *)(lVar2 + 0x1e)] == 0) {
            aiStack_138[local_13c] = *(int *)(lVar2 + 0x18);
            local_140 = local_140 + 1;
          }
          else {
            aiStack_138[local_13c] = local_140 + 1;
            local_140 = *(int *)(lVar2 + 0x18);
          }
          local_13c = local_13c + 1;
        }
        else {
          for (iVar3 = 0; iVar3 < (int)(uint)*(ushort *)(lVar2 + 0x1c); iVar3 = iVar3 + 1) {
            std::vector<pbrt::Primitive,_std::allocator<pbrt::Primitive>_>::operator[]
                      ((vector<pbrt::Primitive,_std::allocator<pbrt::Primitive>_> *)
                       &(in_RDI->super_Tuple3<pbrt::Vector3,_float>).z,
                       (long)(*(int *)(lVar2 + 0x18) + iVar3));
            bVar1 = Primitive::IntersectP
                              (this_00,(Ray *)CONCAT44(iVar3,in_stack_fffffffffffffe48),
                               (Float)((ulong)in_RDI >> 0x20));
            if (bVar1) {
              *(long *)(*in_FS_OFFSET + -0x360) =
                   (long)local_144 + *(long *)(*in_FS_OFFSET + -0x360);
              return true;
            }
          }
          if (local_13c == 0) goto LAB_005f65a2;
          local_13c = local_13c + -1;
          local_140 = aiStack_138[local_13c];
        }
      }
      if (local_13c == 0) break;
      local_13c = local_13c + -1;
      local_140 = aiStack_138[local_13c];
    }
LAB_005f65a2:
    *(long *)(*in_FS_OFFSET + -0x360) = (long)local_144 + *(long *)(*in_FS_OFFSET + -0x360);
  }
  return false;
}

Assistant:

bool BVHAggregate::IntersectP(const Ray &ray, Float tMax) const {
    if (!nodes)
        return false;
    Vector3f invDir(1.f / ray.d.x, 1.f / ray.d.y, 1.f / ray.d.z);
    int dirIsNeg[3] = {static_cast<int>(invDir.x < 0), static_cast<int>(invDir.y < 0),
                       static_cast<int>(invDir.z < 0)};
    int nodesToVisit[64];
    int toVisitOffset = 0, currentNodeIndex = 0;
    int nodesVisited = 0;

    while (true) {
        ++nodesVisited;
        const LinearBVHNode *node = &nodes[currentNodeIndex];
        if (node->bounds.IntersectP(ray.o, ray.d, tMax, invDir, dirIsNeg)) {
            // Process BVH node _node_ for traversal
            if (node->nPrimitives > 0) {
                for (int i = 0; i < node->nPrimitives; ++i) {
                    if (primitives[node->primitivesOffset + i].IntersectP(ray, tMax)) {
                        bvhNodesVisited += nodesVisited;
                        return true;
                    }
                }
                if (toVisitOffset == 0)
                    break;
                currentNodeIndex = nodesToVisit[--toVisitOffset];
            } else {
                if (dirIsNeg[node->axis] != 0) {
                    /// second child first
                    nodesToVisit[toVisitOffset++] = currentNodeIndex + 1;
                    currentNodeIndex = node->secondChildOffset;
                } else {
                    nodesToVisit[toVisitOffset++] = node->secondChildOffset;
                    currentNodeIndex = currentNodeIndex + 1;
                }
            }
        } else {
            if (toVisitOffset == 0)
                break;
            currentNodeIndex = nodesToVisit[--toVisitOffset];
        }
    }
    bvhNodesVisited += nodesVisited;
    return false;
}